

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

SUNErrCode
SUNLinSolSetPreconditioner_SPFGMR
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  SUNPSolveFn Psolve_local;
  SUNPSetupFn Psetup_local;
  void *PData_local;
  SUNLinearSolver S_local;
  
  *(SUNPSetupFn *)((long)S->content + 0x38) = Psetup;
  *(SUNPSolveFn *)((long)S->content + 0x40) = Psolve;
  *(void **)((long)S->content + 0x48) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPFGMR(SUNLinearSolver S, void* PData,
                                             SUNPSetupFn Psetup,
                                             SUNPSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPFGMR_CONTENT(S)->Psetup = Psetup;
  SPFGMR_CONTENT(S)->Psolve = Psolve;
  SPFGMR_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}